

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O3

JoinCurveEnd * __thiscall JoinCurveEnd::operator=(JoinCurveEnd *this,JoinCurveEnd *src)

{
  double dVar1;
  int iVar2;
  
  if (this != src) {
    iVar2 = src->m_end;
    this->m_cid = src->m_cid;
    this->m_end = iVar2;
    this->m_bTanOK = src->m_bTanOK;
    dVar1 = (src->m_P).y;
    (this->m_P).x = (src->m_P).x;
    (this->m_P).y = dVar1;
    (this->m_P).z = (src->m_P).z;
    dVar1 = (src->m_T).y;
    (this->m_T).x = (src->m_T).x;
    (this->m_T).y = dVar1;
    (this->m_T).z = (src->m_T).z;
  }
  return this;
}

Assistant:

JoinCurveEnd& JoinCurveEnd::operator=(const JoinCurveEnd& src)
{
  if ( this != &src ) 
  {
    m_cid = src.m_cid;
    m_end = src.m_end;
    m_bTanOK = src.m_bTanOK;
    m_P = src.m_P;
    m_T = src.m_T;
  }
  return *this;
}